

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O0

void __thiscall cmCMakePresetsGraph::TestPreset::TestPreset(TestPreset *this,TestPreset *param_1)

{
  TestPreset *param_1_local;
  TestPreset *this_local;
  
  Preset::Preset(&this->super_Preset,&param_1->super_Preset);
  (this->super_Preset)._vptr_Preset = (_func_int **)&PTR__TestPreset_00fe9268;
  std::__cxx11::string::string((string *)&this->ConfigurePreset,(string *)&param_1->ConfigurePreset)
  ;
  (this->InheritConfigureEnvironment).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool> =
       (param_1->InheritConfigureEnvironment).super__Optional_base<bool,_true,_true>._M_payload.
       super__Optional_payload_base<bool>;
  std::__cxx11::string::string((string *)&this->Configuration,(string *)&param_1->Configuration);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->OverwriteConfigurationFile,&param_1->OverwriteConfigurationFile);
  std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::optional
            (&this->Output,&param_1->Output);
  std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::optional
            (&this->Filter,&param_1->Filter);
  std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::optional
            (&this->Execution,&param_1->Execution);
  return;
}

Assistant:

TestPreset(TestPreset&& /*other*/) = default;